

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<double,long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  ulong *puVar12;
  long lVar13;
  ulong *puVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble in_ST1;
  longdouble lVar19;
  longdouble lVar20;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble local_134;
  longdouble local_f4;
  ulong local_c8;
  double local_88;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  lVar10 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  local_88 = -INFINITY;
  if ((lVar10 != lVar1) && (uVar3 = (end - st) + 1, 1 < uVar3)) {
    puVar11 = ix_arr + st;
    puVar8 = ix_arr + end + 1;
    uVar9 = (long)puVar8 - (long)puVar11 >> 3;
    if (0 < (long)uVar9) {
      do {
        uVar4 = uVar9 >> 1;
        uVar5 = ~uVar4 + uVar9;
        uVar9 = uVar4;
        if ((puVar11 + uVar4 + 1)[-1] < (ulong)Xc_ind[lVar10]) {
          puVar11 = puVar11 + uVar4 + 1;
          uVar9 = uVar5;
        }
      } while (0 < (long)uVar9);
    }
    uVar9 = Xc_ind[lVar1 + -1];
    if (missing_action == Fail) {
      if (puVar11 == puVar8) {
        return -INFINITY;
      }
      lVar16 = (longdouble)0;
      lVar19 = lVar16;
      local_134 = lVar16;
      local_f4 = lVar16;
      while (uVar4 = *puVar11, uVar4 <= uVar9) {
        puVar14 = (ulong *)(Xc_ind + lVar10);
        uVar5 = *puVar14;
        if (uVar5 == uVar4) {
          lVar19 = lVar19 + (longdouble)Xc[lVar10];
          lVar16 = in_ST2;
          lVar17 = in_ST3;
          in_ST2 = in_ST3;
          lVar18 = in_ST3;
          fmal();
          fmal();
          fmal();
          local_134 = in_ST0;
          local_f4 = in_ST1;
          if ((puVar11 == ix_arr + end) || (lVar10 == lVar1 + -1)) break;
          puVar14 = puVar14 + 1;
          puVar11 = puVar11 + 1;
          uVar4 = (long)Xc_ind + (lVar1 * 8 - (long)puVar14) >> 3;
          if (0 < (long)uVar4) {
            do {
              uVar5 = uVar4 >> 1;
              uVar6 = ~uVar5 + uVar4;
              uVar4 = uVar5;
              if (puVar14[uVar5] < *puVar11) {
                puVar14 = puVar14 + uVar5 + 1;
                uVar4 = uVar6;
              }
            } while (0 < (long)uVar4);
          }
          lVar10 = (long)puVar14 - (long)Xc_ind >> 3;
          lVar15 = in_ST3;
          in_ST3 = lVar18;
        }
        else {
          lVar15 = in_ST0;
          lVar17 = in_ST1;
          if ((long)uVar4 < (long)uVar5) {
            puVar11 = puVar11 + 1;
            uVar4 = (long)puVar8 - (long)puVar11 >> 3;
            while (0 < (long)uVar4) {
              uVar6 = uVar4 >> 1;
              uVar7 = ~uVar6 + uVar4;
              uVar4 = uVar6;
              if ((puVar11 + uVar6 + 1)[-1] < uVar5) {
                puVar11 = puVar11 + uVar6 + 1;
                uVar4 = uVar7;
              }
            }
          }
          else {
            puVar12 = puVar14 + 1;
            uVar5 = (long)Xc_ind + (lVar1 * 8 - (long)(puVar14 + 1)) >> 3;
            while (0 < (long)uVar5) {
              uVar6 = uVar5 >> 1;
              uVar7 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if (puVar12[uVar6] < uVar4) {
                puVar12 = puVar12 + uVar6 + 1;
                uVar5 = uVar7;
              }
            }
            lVar10 = (long)puVar12 - (long)Xc_ind >> 3;
          }
        }
        if ((puVar11 == puVar8) || (in_ST0 = lVar15, in_ST1 = lVar17, lVar10 == lVar1)) break;
      }
    }
    else {
      lVar19 = (longdouble)0;
      lVar16 = lVar19;
      local_134 = lVar19;
      local_f4 = lVar19;
      local_c8 = uVar3;
      if (puVar11 != puVar8) {
        lVar19 = (longdouble)0;
        lVar13 = lVar10;
        lVar16 = lVar19;
        local_134 = lVar19;
        local_f4 = lVar19;
        while (uVar4 = *puVar11, uVar4 <= uVar9) {
          puVar14 = (ulong *)(Xc_ind + lVar13);
          uVar5 = *puVar14;
          lVar17 = in_ST0;
          lVar18 = in_ST1;
          if (uVar5 == uVar4) {
            lVar15 = (longdouble)Xc[lVar13];
            local_68 = SUB108(lVar15,0);
            uStack_60 = (ushort)((unkuint10)lVar15 >> 0x40);
            if ((NAN(Xc[lVar13])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)
               ) {
              local_c8 = local_c8 - 1;
            }
            else {
              lVar19 = lVar19 + lVar15;
              lVar16 = in_ST2;
              lVar18 = in_ST3;
              in_ST2 = in_ST3;
              lVar15 = in_ST3;
              fmal();
              fmal();
              fmal();
              lVar17 = in_ST3;
              in_ST3 = lVar15;
              local_134 = in_ST0;
              local_f4 = in_ST1;
            }
            if ((puVar11 == ix_arr + end) || (lVar13 == lVar1 + -1)) break;
            puVar12 = puVar14 + 1;
            puVar11 = puVar11 + 1;
            uVar4 = (long)Xc_ind + (lVar1 * 8 - (long)puVar12) >> 3;
            if (0 < (long)uVar4) {
              do {
                uVar5 = uVar4 >> 1;
                uVar6 = ~uVar5 + uVar4;
                uVar4 = uVar5;
                if (puVar12[uVar5] < *puVar11) {
                  puVar12 = puVar12 + uVar5 + 1;
                  uVar4 = uVar6;
                }
              } while (0 < (long)uVar4);
            }
LAB_0012dca6:
            lVar13 = (long)puVar12 - (long)Xc_ind >> 3;
            in_ST0 = lVar17;
            in_ST1 = lVar18;
          }
          else {
            if ((long)uVar5 <= (long)uVar4) {
              puVar12 = puVar14 + 1;
              uVar5 = (long)Xc_ind + (lVar1 * 8 - (long)(puVar14 + 1)) >> 3;
              while (0 < (long)uVar5) {
                uVar6 = uVar5 >> 1;
                uVar7 = ~uVar6 + uVar5;
                uVar5 = uVar6;
                if (puVar12[uVar6] < uVar4) {
                  puVar12 = puVar12 + uVar6 + 1;
                  uVar5 = uVar7;
                }
              }
              goto LAB_0012dca6;
            }
            puVar11 = puVar11 + 1;
            uVar4 = (long)puVar8 - (long)puVar11 >> 3;
            while (0 < (long)uVar4) {
              uVar6 = uVar4 >> 1;
              uVar7 = ~uVar6 + uVar4;
              uVar4 = uVar6;
              if ((puVar11 + uVar6 + 1)[-1] < uVar5) {
                puVar11 = puVar11 + uVar6 + 1;
                uVar4 = uVar7;
              }
            }
          }
          if ((puVar11 == puVar8) || (lVar13 == lVar1)) break;
        }
      }
      lVar10 = lVar10 + uVar3;
      uVar3 = local_c8;
      if (local_c8 <= (ulong)(lVar10 - lVar1)) {
        return -INFINITY;
      }
    }
    if (1 < uVar3) {
      if ((local_134 != (longdouble)0) || (NAN(local_134) || NAN((longdouble)0))) {
        if ((local_134 != lVar19 * lVar19) || (NAN(local_134) || NAN(lVar19 * lVar19))) {
          lVar17 = (longdouble)(long)uVar3 + (longdouble)(float)(&DAT_0036e0d8)[(long)uVar3 < 0];
          lVar18 = lVar19 / lVar17;
          lVar15 = lVar18 * lVar18;
          lVar20 = local_134 / lVar17 - lVar15;
          if ((!NAN(lVar20)) &&
             (((longdouble)2.220446e-16 < lVar20 ||
              (bVar2 = check_more_than_two_unique_values<double,long>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar2))
             )) {
            if (lVar20 <= (longdouble)0) {
              local_88 = 0.0;
            }
            else {
              lVar19 = (lVar15 * lVar18 * lVar18 * lVar17 +
                       lVar19 * (longdouble)-4.0 * lVar15 * lVar18 +
                       local_134 * (longdouble)6.0 * lVar15 +
                       lVar16 + local_f4 * (longdouble)-4.0 * lVar18) / (lVar20 * lVar20 * lVar17);
              uStack_70 = (ushort)((unkuint10)lVar19 >> 0x40);
              local_78 = SUB108(lVar19,0);
              if ((((unkuint10)lVar19 & 0x7fff) == 0 ||
                   (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) &&
                 (local_88 = (double)lVar19, local_88 <= 0.0)) {
                local_88 = 0.0;
              }
            }
          }
        }
      }
    }
  }
  return local_88;
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}